

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O1

bool MeCab::FeatureIndex::convert(Param *param,char *txtfile,string *output)

{
  char *pcVar1;
  pair<unsigned_long,_double> *ppVar2;
  iterator iVar3;
  string *psVar4;
  Param *this;
  bool bVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  char *__s;
  long *plVar10;
  char *pcVar11;
  uint64_t uVar12;
  ulong uVar13;
  char **ppcVar14;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  string model_charset;
  vector<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_> dic;
  string from;
  double alpha;
  Iconv iconv;
  string to;
  char charset_buf [32];
  char *column [4];
  uint size;
  ifstream ifs;
  die local_32a;
  die local_329;
  char *local_328;
  char *local_320;
  char local_318 [16];
  pair<unsigned_long,_double> *local_308;
  iterator iStack_300;
  pair<unsigned_long,_double> *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string *local_2d0;
  pair<unsigned_long,_double> local_2c8;
  Iconv local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  char *local_268 [4];
  Param *local_248;
  undefined4 local_23c;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,txtfile,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
               ,0x73);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x21d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"ifs",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"no such file or directory: ",0x1b);
    if (txtfile == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar9 = strlen(txtfile);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,txtfile,sVar9);
    }
    die::~die((die *)local_268);
  }
  local_2d0 = output;
  local_248 = param;
  __s = (char *)operator_new__(0x2000);
  local_2f8 = (pair<unsigned_long,_double> *)0x0;
  local_308 = (pair<unsigned_long,_double> *)0x0;
  iStack_300._M_current = (pair<unsigned_long,_double> *)0x0;
  local_328 = local_318;
  local_320 = (char *)0x0;
  local_318[0] = '\0';
  do {
    std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
    plVar10 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
    this = local_248;
    if (((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) || (*__s == '\0')
       ) {
      Param::get<std::__cxx11::string>(&local_2f0,local_248,"dictionary-charset");
      Param::get<std::__cxx11::string>(&local_2a8,this,"charset");
      if (local_2f0._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_2f0);
      }
      else {
        iVar6 = decode_charset(local_328);
        iVar7 = decode_charset(local_2f0._M_dataplus._M_p);
        if (iVar6 != iVar7) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x233);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"decode_charset(model_charset.c_str()) == decode_charset(from.c_str())",
                     0x45);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"dictionary charset and model charset are different. ",0x34);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"dictionary_charset=",0x13);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," model_charset=",0xf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_328,(long)local_320);
          die::~die((die *)&local_288);
        }
      }
      if (local_2a8._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&local_2a8);
      }
      Iconv::Iconv(&local_2b8);
      iVar6 = Iconv::open(&local_2b8,local_2f0._M_dataplus._M_p,(int)local_2a8._M_dataplus._M_p);
      if ((char)iVar6 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                   ,0x73);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x240);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,"iconv.open(from.c_str(), to.c_str())",0x24);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"cannot create model from=",0x19);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," to=",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
        die::~die(&local_329);
      }
      do {
        std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
        plVar10 = (long *)std::istream::getline((char *)local_238,(long)__s,'\0');
        psVar4 = local_2d0;
        if ((*(byte *)((long)plVar10 + *(long *)(*plVar10 + -0x18) + 0x20) & 5) != 0) {
          local_2d0->_M_string_length = 0;
          *(local_2d0->_M_dataplus)._M_p = '\0';
          local_23c = (undefined4)((ulong)((long)iStack_300._M_current - (long)local_308) >> 4);
          std::__cxx11::string::append((char *)local_2d0,(ulong)&local_23c);
          local_288.field_2._M_allocated_capacity = 0;
          local_288.field_2._8_8_ = 0;
          local_288._M_dataplus._M_p = (pointer)0x0;
          local_288._M_string_length = 0;
          strncpy((char *)&local_288,local_2a8._M_dataplus._M_p,0x1f);
          std::__cxx11::string::append((char *)psVar4,(ulong)&local_288);
          iVar3._M_current = iStack_300._M_current;
          ppVar2 = local_308;
          if (local_308 != iStack_300._M_current) {
            uVar13 = (long)iStack_300._M_current - (long)local_308 >> 4;
            lVar17 = 0x3f;
            if (uVar13 != 0) {
              for (; uVar13 >> lVar17 == 0; lVar17 = lVar17 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_308,iStack_300._M_current,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,double>*,std::vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (ppVar2,iVar3._M_current);
          }
          if (iStack_300._M_current != local_308) {
            lVar17 = 8;
            uVar13 = 0;
            do {
              local_2c8.first = *(uint64_t *)((long)&local_308->first + lVar17);
              std::__cxx11::string::append((char *)local_2d0,(ulong)&local_2c8);
              uVar13 = uVar13 + 1;
              lVar17 = lVar17 + 0x10;
            } while (uVar13 < (ulong)((long)iStack_300._M_current - (long)local_308 >> 4));
          }
          if (iStack_300._M_current != local_308) {
            lVar17 = 0;
            uVar13 = 0;
            do {
              local_2c8.first = *(uint64_t *)((long)&local_308->first + lVar17);
              std::__cxx11::string::append((char *)local_2d0,(ulong)&local_2c8);
              uVar13 = uVar13 + 1;
              lVar17 = lVar17 + 0x10;
            } while (uVar13 < (ulong)((long)iStack_300._M_current - (long)local_308 >> 4));
          }
          Iconv::~Iconv(&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
            operator_delete(local_2a8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p);
          }
          if (local_328 != local_318) {
            operator_delete(local_328);
          }
          if (local_308 != (pair<unsigned_long,_double> *)0x0) {
            operator_delete(local_308);
          }
          operator_delete__(__s);
          std::ifstream::~ifstream(local_238);
          return true;
        }
        sVar9 = strlen(__s);
        pcVar11 = __s + sVar9;
        ppcVar14 = local_268;
        uVar13 = 0;
        pcVar15 = __s;
        do {
          pcVar1 = pcVar15;
          if (1 < uVar13) break;
          for (; (pcVar16 = pcVar11, pcVar1 != pcVar11 && (pcVar16 = pcVar1, *pcVar1 != '\t'));
              pcVar1 = pcVar1 + 1) {
          }
          *pcVar16 = '\0';
          if (*pcVar15 != '\0') {
            *ppcVar14 = pcVar15;
            ppcVar14 = ppcVar14 + 1;
            uVar13 = uVar13 + 1;
          }
          pcVar15 = pcVar16 + 1;
        } while (pcVar16 != pcVar11);
        if (uVar13 != 2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x245);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"tokenize2(buf.get(), \"\\t\", column, 2) == 2",0x2a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
          sVar9 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
          die::~die((die *)&local_288);
        }
        std::__cxx11::string::string((string *)&local_288,local_268[1],(allocator *)&local_2c8);
        bVar5 = Iconv::convert(&local_2b8,&local_288);
        if (!bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                     ,0x73);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x248);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"iconv.convert(&feature)",0x17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
          if (!bVar5) {
            die::~die(&local_32a);
          }
        }
        uVar12 = fingerprint(&local_288);
        local_2c8.second = atof(local_268[0]);
        local_2c8.first = uVar12;
        if (iStack_300._M_current == local_2f8) {
          std::
          vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>::
          _M_realloc_insert<std::pair<unsigned_long,double>>
                    ((vector<std::pair<unsigned_long,double>,std::allocator<std::pair<unsigned_long,double>>>
                      *)&local_308,iStack_300,&local_2c8);
        }
        else {
          (iStack_300._M_current)->first = uVar12;
          (iStack_300._M_current)->second = local_2c8.second;
          iStack_300._M_current = iStack_300._M_current + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p);
        }
      } while( true );
    }
    sVar9 = strlen(__s);
    pcVar11 = __s + sVar9;
    ppcVar14 = local_268;
    uVar13 = 0;
    pcVar15 = __s;
    do {
      pcVar1 = pcVar15;
      if (1 < uVar13) break;
      for (; (pcVar16 = pcVar11, pcVar1 != pcVar11 && (pcVar16 = pcVar1, *pcVar1 != ':'));
          pcVar1 = pcVar1 + 1) {
      }
      *pcVar16 = '\0';
      if (*pcVar15 != '\0') {
        *ppcVar14 = pcVar15;
        ppcVar14 = ppcVar14 + 1;
        uVar13 = uVar13 + 1;
      }
      pcVar15 = pcVar16 + 1;
    } while (pcVar16 != pcVar11);
    if (uVar13 != 2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                 ,0x73);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x227);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,") [",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"tokenize2(buf.get(), \":\", column, 2) == 2",0x29);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"format error: ",0xe);
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,__s,sVar9);
      die::~die((die *)&local_2f0);
    }
    std::__cxx11::string::string((string *)&local_2f0,local_268[0],(allocator *)&local_2a8);
    iVar6 = std::__cxx11::string::compare((char *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    pcVar15 = local_320;
    if (iVar6 == 0) {
      pcVar11 = local_268[1] + 1;
      strlen(pcVar11);
      std::__cxx11::string::_M_replace((ulong)&local_328,0,pcVar15,(ulong)pcVar11);
    }
  } while( true );
}

Assistant:

bool FeatureIndex::convert(const Param &param,
                           const char* txtfile, std::string *output) {
  std::ifstream ifs(WPATH(txtfile));
  CHECK_DIE(ifs) << "no such file or directory: " << txtfile;
  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[4];
  std::vector<std::pair<uint64_t, double> > dic;
  std::string model_charset;

  while (ifs.getline(buf.get(), buf.size())) {
    if (std::strlen(buf.get()) == 0) {
      break;
    }
    CHECK_DIE(tokenize2(buf.get(), ":", column, 2) == 2)
        << "format error: " << buf.get();
    if (std::string(column[0]) == "charset") {
      model_charset = column[1] + 1;
    }
  }

  std::string from = param.get<std::string>("dictionary-charset");
  std::string to = param.get<std::string>("charset");

  if (!from.empty()) {
    CHECK_DIE(decode_charset(model_charset.c_str())
              == decode_charset(from.c_str()))
        << "dictionary charset and model charset are different. "
        << "dictionary_charset=" << from
        << " model_charset=" << model_charset;
  } else {
    from = model_charset;
  }

  if (to.empty()) {
    to = from;
  }

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
            << "cannot create model from=" << from
            << " to=" << to;

  while (ifs.getline(buf.get(), buf.size())) {
    CHECK_DIE(tokenize2(buf.get(), "\t", column, 2) == 2)
        << "format error: " << buf.get();
    std::string feature = column[1];
    CHECK_DIE(iconv.convert(&feature));
    const uint64_t fp = fingerprint(feature);
    const double alpha = atof(column[0]);
    dic.push_back(std::pair<uint64_t, double>(fp, alpha));
  }

  output->clear();
  unsigned int size = static_cast<unsigned int>(dic.size());
  output->append(reinterpret_cast<const char*>(&size), sizeof(size));

  char charset_buf[32];
  std::fill(charset_buf, charset_buf + sizeof(charset_buf), '\0');
  std::strncpy(charset_buf, to.c_str(), 31);
  output->append(reinterpret_cast<const char *>(charset_buf),
                 sizeof(charset_buf));

  std::sort(dic.begin(), dic.end());

  for (size_t i = 0; i < dic.size(); ++i) {
    const double alpha = dic[i].second;
    output->append(reinterpret_cast<const char *>(&alpha), sizeof(alpha));
  }

  for (size_t i = 0; i < dic.size(); ++i) {
    const uint64_t fp = dic[i].first;
    output->append(reinterpret_cast<const char *>(&fp), sizeof(fp));
  }

  return true;
}